

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.c
# Opt level: O1

Bigint * Balloc(int k)

{
  ulong uVar1;
  Bigint *pBVar2;
  ulong uVar3;
  int iVar4;
  
  if (k < 8) {
    pBVar2 = TI0.Freelist[k];
    if (pBVar2 != (Bigint *)0x0) {
      TI0.Freelist[k] = pBVar2->next;
      goto LAB_00105806;
    }
  }
  iVar4 = 1 << ((byte)k & 0x1f);
  uVar1 = (long)iVar4 * 4 + 0x23;
  if (k < 8) {
    uVar3 = uVar1 >> 3 & 0xffffffff;
    if (0x120 < ((long)(pmem_next + -0x22da4) >> 3) + uVar3) goto LAB_001057ee;
    pBVar2 = (Bigint *)pmem_next;
    pmem_next = pmem_next + uVar3;
  }
  else {
LAB_001057ee:
    pBVar2 = (Bigint *)malloc(uVar1 & 0x7fffffff8);
  }
  pBVar2->k = k;
  pBVar2->maxwds = iVar4;
LAB_00105806:
  pBVar2->sign = 0;
  pBVar2->wds = 0;
  return pBVar2;
}

Assistant:

static Bigint *
Balloc(int k MTd)
{
	int x;
	Bigint *rv;
#ifndef Omit_Private_Memory
	unsigned int len;
#endif
#ifdef MULTIPLE_THREADS
	ThInfo *TI;

	if (!(TI = *PTI))
		*PTI = TI = get_TI();
	if (TI == &TI0)
		ACQUIRE_DTOA_LOCK(0);
#endif
	/* The k > Kmax case does not need ACQUIRE_DTOA_LOCK(0), */
	/* but this case seems very unlikely. */
	if (k <= Kmax && (rv = freelist[k]))
		freelist[k] = rv->next;
	else {
		x = 1 << k;
#ifdef Omit_Private_Memory
		rv = (Bigint *)MALLOC(sizeof(Bigint) + (x-1)*sizeof(ULong));
#else
		len = (sizeof(Bigint) + (x-1)*sizeof(ULong) + sizeof(double) - 1)
			/sizeof(double);
		if (k <= Kmax && pmem_next - private_mem + len <= PRIVATE_mem
#ifdef MULTIPLE_THREADS
			&& TI == TI1
#endif
			) {
			rv = (Bigint*)pmem_next;
			pmem_next += len;
			}
		else
			rv = (Bigint*)MALLOC(len*sizeof(double));
#endif
		rv->k = k;
		rv->maxwds = x;
		}
#ifdef MULTIPLE_THREADS
	if (TI == &TI0)
		FREE_DTOA_LOCK(0);
#endif
	rv->sign = rv->wds = 0;
	return rv;
	}